

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O3

void __thiscall
llvm::DWARFContext::addLocalsForDie
          (DWARFContext *this,DWARFCompileUnit *CU,DWARFDie Subprogram,DWARFDie Die,
          vector<llvm::DILocal,_std::allocator<llvm::DILocal>_> *Result)

{
  byte bVar1;
  Tag TVar2;
  DWARFAbbreviationDeclaration *pDVar3;
  DWARFUnit *pDVar4;
  undefined8 uVar5;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar6;
  int iVar7;
  ulong uVar8;
  LineTable *pLVar9;
  char *pcVar10;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  uint64_t PointerSize;
  uchar *puVar14;
  Optional<const_char_*> OVar15;
  Optional<unsigned_long> OVar16;
  DWARFDie DVar17;
  DWARFDie DVar18;
  StringRef CompDir;
  undefined1 local_148 [8];
  Optional<llvm::ArrayRef<unsigned_char>_> Location;
  iterator __begin1;
  _Alloc_hider local_110;
  char *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  string local_f0;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_d0;
  ulong local_c8;
  char local_c0;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_b8;
  undefined1 local_b0;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_a8;
  undefined1 local_a0;
  DWARFCompileUnit *local_98;
  undefined1 local_90 [8];
  Optional<llvm::DWARFFormValue> NameAttr;
  DWARFDie local_50;
  DWARFDie local_40;
  
  NameAttr.Storage._48_8_ = this;
  local_50 = Subprogram;
  local_40 = Die;
  if ((Die.U == (DWARFUnit *)0x0) || (Die.Die == (DWARFDebugInfoEntry *)0x0)) {
    __assert_fail("isValid() && \"must check validity prior to calling\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFDie.h"
                  ,0x3b,
                  "const DWARFAbbreviationDeclaration *llvm::DWARFDie::getAbbreviationDeclarationPtr() const"
                 );
  }
  pDVar3 = (Die.Die)->AbbrevDecl;
  if (pDVar3 == (DWARFAbbreviationDeclaration *)0x0) goto LAB_00ae1bcf;
  TVar2 = pDVar3->Tag;
  if (TVar2 != DW_TAG_variable) {
    if (TVar2 == DW_TAG_inlined_subroutine) {
      DVar17 = DWARFDie::getAttributeValueAsReferencedDie(&local_40,DW_AT_abstract_origin);
      if (DVar17.Die != (DWARFDebugInfoEntry *)0x0 && DVar17.U != (DWARFUnit *)0x0) {
        local_50 = DVar17;
      }
LAB_00ae1bcf:
      DVar17 = DWARFDie::getFirstChild(&local_40);
      unique0x1000073f = DVar17;
      local_98 = CU;
      DVar18 = DWARFDie::getLastChild(&local_40);
      uVar5 = NameAttr.Storage._48_8_;
      while (DVar17 != DVar18) {
        addLocalsForDie((DWARFContext *)uVar5,local_98,local_50,DVar17,Result);
        DVar17 = DWARFDie::getSibling((DWARFDie *)&Location.Storage.hasVal);
        unique0x100008a7 = DVar17;
      }
      return;
    }
    if (TVar2 != DW_TAG_formal_parameter) goto LAB_00ae1bcf;
  }
  __begin1.Die.U = (DWARFUnit *)0x0;
  Location.Storage._16_8_ = &__begin1.Die.Die;
  __begin1.Die.Die._0_1_ = 0;
  local_110._M_p = (pointer)&local_100;
  local_108 = (char *)0x0;
  local_100._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_d0.value = 0;
  local_c8 = local_c8 & 0xffffffffffffff00;
  local_c0 = '\0';
  local_b8.value = local_b8.value & 0xffffffffffffff00;
  local_b0 = 0;
  local_a8.value = local_a8.value & 0xffffffffffffff00;
  local_a0 = 0;
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,&local_50,DW_AT_name);
  if (NameAttr.Storage.field_0._40_1_ == '\x01') {
    OVar15 = DWARFFormValue::getAsCString((DWARFFormValue *)local_90);
    if (((undefined1  [16])OVar15.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pDVar4 = __begin1.Die.U;
      strlen(OVar15.Storage.field_0.value);
      std::__cxx11::string::_M_replace
                ((ulong)&Location.Storage.hasVal,0,(char *)pDVar4,(ulong)OVar15.Storage.field_0);
    }
  }
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,&local_40,DW_AT_location);
  if ((((NameAttr.Storage.field_0._40_1_ == '\x01') &&
       (DWARFFormValue::getAsBlock
                  ((Optional<llvm::ArrayRef<unsigned_char>_> *)local_148,(DWARFFormValue *)local_90)
       , Location.Storage.field_0.value.Length._0_1_ == '\x01')) &&
      (Location.Storage.field_0.value.Data != (uchar *)0x0)) && (*(uchar *)local_148 == 0x91)) {
    local_c8 = 0;
    puVar14 = &DAT_00000001;
    uVar13 = 0;
    uVar12 = 0;
    do {
      if (Location.Storage.field_0.value.Data == puVar14) goto LAB_00ae1a77;
      bVar1 = *(byte *)((long)local_148 + (long)puVar14);
      uVar13 = uVar13 | (ulong)(bVar1 & 0x7f) << ((byte)uVar12 & 0x3f);
      uVar12 = uVar12 + 7;
      puVar14 = puVar14 + 1;
    } while ((char)bVar1 < '\0');
    uVar8 = -1L << ((byte)uVar12 & 0x3f);
    if (bVar1 < 0x40) {
      uVar8 = 0;
    }
    if (0x3f < uVar12) {
      uVar8 = 0;
    }
    local_c8 = uVar13 | uVar8;
LAB_00ae1a77:
    if (local_c0 == '\0') {
      local_c0 = '\x01';
    }
  }
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,&local_40,DW_AT_LLVM_tag_offset);
  if (NameAttr.Storage.field_0._40_1_ == '\x01') {
    OVar16 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_90);
    local_a8 = OVar16.Storage.field_0;
    local_a0 = OVar16.Storage.hasVal;
  }
  DVar17 = DWARFDie::getAttributeValueAsReferencedDie(&local_40,DW_AT_abstract_origin);
  if (DVar17.Die != (DWARFDebugInfoEntry *)0x0 && DVar17.U != (DWARFUnit *)0x0) {
    local_40 = DVar17;
  }
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,&local_40,DW_AT_name);
  if (NameAttr.Storage.field_0._40_1_ == '\x01') {
    OVar15 = DWARFFormValue::getAsCString((DWARFFormValue *)local_90);
    pcVar10 = local_108;
    if (((undefined1  [16])OVar15.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      strlen(OVar15.Storage.field_0.value);
      std::__cxx11::string::_M_replace((ulong)&local_110,0,pcVar10,(ulong)OVar15.Storage.field_0);
    }
  }
  DVar17 = DWARFDie::getAttributeValueAsReferencedDie(&local_40,DW_AT_type);
  uVar5 = NameAttr.Storage._48_8_;
  if (DVar17.Die != (DWARFDebugInfoEntry *)0x0 && DVar17.U != (DWARFUnit *)0x0) {
    parseNormalUnits((DWARFContext *)NameAttr.Storage._48_8_);
    iVar7 = *(int *)(uVar5 + 0x48);
    if (iVar7 == -1) {
      iVar7 = *(int *)(uVar5 + 0x18);
    }
    if (iVar7 == 0) {
      PointerSize = 0;
    }
    else {
      PointerSize = (uint64_t)*(byte *)(**(long **)(uVar5 + 0x10) + 0x22);
    }
    OVar16 = getTypeSize(DVar17,PointerSize);
    local_b8 = OVar16.Storage.field_0;
    local_b0 = OVar16.Storage.hasVal;
  }
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,&local_40,DW_AT_decl_file);
  if ((NameAttr.Storage.field_0._40_1_ == '\x01') &&
     (pLVar9 = getLineTableForUnit((CU->super_DWARFUnit).Context,&CU->super_DWARFUnit),
     pLVar9 != (LineTable *)0x0)) {
    if (NameAttr.Storage.field_0._40_1_ == '\0') {
      pcVar10 = 
      "T &llvm::optional_detail::OptionalStorage<llvm::DWARFFormValue>::getValue() & [T = llvm::DWARFFormValue]"
      ;
      goto LAB_00ae1e4d;
    }
    OVar16 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_90);
    if (((undefined1  [16])OVar16.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar10 = DWARFUnit::getCompilationDir(&CU->super_DWARFUnit);
      if (pcVar10 == (char *)0x0) {
        sVar11 = 0;
      }
      else {
        sVar11 = strlen(pcVar10);
      }
      CompDir.Length = sVar11;
      CompDir.Data = pcVar10;
      DWARFDebugLine::Prologue::getFileNameByIndex
                (&pLVar9->Prologue,OVar16.Storage.field_0.value,CompDir,AbsoluteFilePath,&local_f0,
                 native);
      goto LAB_00ae1d43;
    }
  }
  else {
LAB_00ae1d43:
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,&local_40,DW_AT_decl_line);
    aVar6 = local_d0;
    if (NameAttr.Storage.field_0._40_1_ != '\x01') {
LAB_00ae1d7a:
      local_d0 = aVar6;
      std::vector<llvm::DILocal,_std::allocator<llvm::DILocal>_>::push_back
                (Result,(value_type *)&Location.Storage.hasVal);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,
                        CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                 local_f0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_p != &local_100) {
        operator_delete(local_110._M_p,
                        CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) +
                        1);
      }
      if ((DWARFDebugInfoEntry **)Location.Storage._16_8_ == &__begin1.Die.Die) {
        return;
      }
      operator_delete((void *)Location.Storage._16_8_,
                      CONCAT71(__begin1.Die.Die._1_7_,__begin1.Die.Die._0_1_) + 1);
      return;
    }
    OVar16 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_90);
    aVar6.value = OVar16.Storage.field_0.value;
    if (((undefined1  [16])OVar16.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_00ae1d7a;
  }
  pcVar10 = 
  "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]";
LAB_00ae1e4d:
  __assert_fail("hasVal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                ,0xad,pcVar10);
}

Assistant:

void DWARFContext::addLocalsForDie(DWARFCompileUnit *CU, DWARFDie Subprogram,
                                   DWARFDie Die, std::vector<DILocal> &Result) {
  if (Die.getTag() == DW_TAG_variable ||
      Die.getTag() == DW_TAG_formal_parameter) {
    DILocal Local;
    if (auto NameAttr = Subprogram.find(DW_AT_name))
      if (Optional<const char *> Name = NameAttr->getAsCString())
        Local.FunctionName = *Name;
    if (auto LocationAttr = Die.find(DW_AT_location))
      if (Optional<ArrayRef<uint8_t>> Location = LocationAttr->getAsBlock())
        if (!Location->empty() && (*Location)[0] == DW_OP_fbreg)
          Local.FrameOffset =
              decodeSLEB128(Location->data() + 1, nullptr, Location->end());
    if (auto TagOffsetAttr = Die.find(DW_AT_LLVM_tag_offset))
      Local.TagOffset = TagOffsetAttr->getAsUnsignedConstant();

    if (auto Origin =
            Die.getAttributeValueAsReferencedDie(DW_AT_abstract_origin))
      Die = Origin;
    if (auto NameAttr = Die.find(DW_AT_name))
      if (Optional<const char *> Name = NameAttr->getAsCString())
        Local.Name = *Name;
    if (auto Type = Die.getAttributeValueAsReferencedDie(DW_AT_type))
      Local.Size = getTypeSize(Type, getCUAddrSize());
    if (auto DeclFileAttr = Die.find(DW_AT_decl_file)) {
      if (const auto *LT = CU->getContext().getLineTableForUnit(CU))
        LT->getFileNameByIndex(
            DeclFileAttr->getAsUnsignedConstant().getValue(),
            CU->getCompilationDir(),
            DILineInfoSpecifier::FileLineInfoKind::AbsoluteFilePath,
            Local.DeclFile);
    }
    if (auto DeclLineAttr = Die.find(DW_AT_decl_line))
      Local.DeclLine = DeclLineAttr->getAsUnsignedConstant().getValue();

    Result.push_back(Local);
    return;
  }

  if (Die.getTag() == DW_TAG_inlined_subroutine)
    if (auto Origin =
            Die.getAttributeValueAsReferencedDie(DW_AT_abstract_origin))
      Subprogram = Origin;

  for (auto Child : Die)
    addLocalsForDie(CU, Subprogram, Child, Result);
}